

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatTest_Dynamic_Test::~FormatTest_Dynamic_Test(FormatTest_Dynamic_Test *this)

{
  void *in_RDI;
  
  ~FormatTest_Dynamic_Test((FormatTest_Dynamic_Test *)0x1a02d8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(FormatTest, Dynamic) {
  typedef fmt::format_context ctx;
  std::vector<fmt::basic_format_arg<ctx>> args;
  args.emplace_back(fmt::internal::make_arg<ctx>(42));
  args.emplace_back(fmt::internal::make_arg<ctx>("abc1"));
  args.emplace_back(fmt::internal::make_arg<ctx>(1.2f));

  std::string result = fmt::vformat("{} and {} and {}",
                                    fmt::basic_format_args<ctx>(
                                        args.data(),
                                        static_cast<unsigned>(args.size())));

  EXPECT_EQ("42 and abc1 and 1.2", result);
}